

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_symbol_table.c
# Opt level: O0

void l2_symbol_table_copy(l2_symbol_node **dest_p,l2_symbol_node *src_p)

{
  l2_symbol_node *plVar1;
  l2_symbol_node *src_p_local;
  l2_symbol_node **dest_p_local;
  
  if (src_p == (l2_symbol_node *)0x0) {
    *dest_p = (l2_symbol_node *)0x0;
  }
  else {
    plVar1 = (l2_symbol_node *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x28);
    *dest_p = plVar1;
    l2_storage_mem_copy(g_parser_p->storage_p,*dest_p,src_p,0x28);
    (*dest_p)->next = (_l2_symbol_node *)0x0;
    l2_symbol_table_copy(&(*dest_p)->next,src_p->next);
  }
  return;
}

Assistant:

void l2_symbol_table_copy(l2_symbol_node **dest_p, l2_symbol_node *src_p) {
    if (!src_p) {
        (*dest_p) = L2_NULL_PTR;
        return;
    }

    *dest_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_symbol_node));
    l2_storage_mem_copy(g_parser_p->storage_p, *dest_p, src_p, sizeof(l2_symbol_node));
    (*dest_p)->next = L2_NULL_PTR;
    l2_symbol_table_copy(&(*dest_p)->next, src_p->next);
}